

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  pair<unsigned_short,_const_void_*> ts;
  pair<unsigned_short,_const_void_*> ts_00;
  uint8_t buff [6];
  uint8_t buff2 [20];
  undefined4 local_50;
  undefined2 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  logger.mLogful = true;
  local_4c = 0xfeca;
  local_50 = 0xefbeadde;
  local_48 = 0xedf8cadeefbeadde;
  uStack_40 = 0xcadeefbeaddefeca;
  local_38 = 0xfecaedf8;
  ts.second = &local_48;
  ts._0_8_ = 0x14;
  Logless<std::pair<unsigned_short,void_const*>>(&logger,"Log me pls %%;",ts);
  Logless<signed_char,signed_char,signed_char>(&logger,"Log me pls %c; and %d; and %x;",'a','a','a')
  ;
  Logless<signed_char,signed_char>(&logger,"Log me pl  %d; and %x;",'a','a');
  Logless<unsigned_char>(&logger,"Log me pls %u;",'a');
  Logless<short>(&logger,"Log me pls %d;",-1);
  Logless<unsigned_short>(&logger,"Log me pls %u;",0xffff);
  Logless<int>(&logger,"Log me pls %d;",-1);
  Logless<unsigned_int>(&logger,"Log me pls %u;",0xffffffff);
  Logless<long>(&logger,"Log me pls %zd;",-1);
  Logless<unsigned_long>(&logger,"Log me pls %zu;",0xffffffffffffffff);
  Logless<float>(&logger,"Log me pls %f;",4.2);
  Logless<double>(&logger,"Log me pls %lf;",4.2);
  ts_00.second = &local_50;
  ts_00._0_8_ = 6;
  Logless<std::pair<unsigned_short,void_const*>>(&logger,"Log me pls %%;",ts_00);
  Logless<char_const*>(&logger,"Log me pls %s;","this iz string");
  runBM();
  fflush((FILE *)logger.mOutputFile);
  return 0;
}

Assistant:

int main()
{
    logger.logful();
    uint8_t buff[] = {0xde,0xad,0xbe,0xef,0xca,0xfe};
    uint8_t buff2[] = {0xde,0xad,0xbe,0xef,0xde,0xca,0xf8,0xed,0xca,0xfe,0xde,0xad,0xbe,0xef,0xde,0xca,0xf8,0xed,0xca,0xfe};

    Logless(logger, "Log me pls %%;", BufferLog(20, buff2));
    Logless(logger, "Log me pls %c; and %d; and %x;", int8_t('a'), int8_t('a'), int8_t('a'));
    Logless(logger, "Log me pl  %d; and %x;", int8_t('a'), int8_t('a'));
    Logless(logger, "Log me pls %u;", uint8_t('a'));
    Logless(logger, "Log me pls %d;", int16_t(0xffff));
    Logless(logger, "Log me pls %u;", uint16_t(0xffff));
    Logless(logger, "Log me pls %d;", int32_t(0xffffffff));
    Logless(logger, "Log me pls %u;", uint32_t(0xffffffff));
    Logless(logger, "Log me pls %zd;", int64_t(0xfffffffffffffffful));
    Logless(logger, "Log me pls %zu;", uint64_t(0xfffffffffffffffful));
    Logless(logger, "Log me pls %f;", float(4.2));
    Logless(logger, "Log me pls %lf;", double(4.2));
    Logless(logger, "Log me pls %%;", BufferLog(6, buff));
    Logless(logger, "Log me pls %s;", "this iz string");

    runBM();

    logger.flush();
}